

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void llvm::DWARFYAML::EmitDebugLoc(raw_ostream *OS,Data *DI)

{
  byte bVar1;
  bool bVar2;
  reference pLVar3;
  const_reference pvVar4;
  size_type sVar5;
  reference puVar6;
  iterator iStack_88;
  uchar x;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range3;
  undefined1 local_58 [7];
  uint8_t AddrSize;
  Loc Loc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_> *__range1;
  Data *DI_local;
  raw_ostream *OS_local;
  
  __end1 = std::vector<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>::begin
                     (&DI->Locs);
  Loc.CompileUnitOffset =
       (uint64_t)
       std::vector<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>::end(&DI->Locs);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_llvm::DWARFYAML::Loc_*,_std::vector<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>_>
                                     *)&Loc.CompileUnitOffset), bVar2) {
    pLVar3 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFYAML::Loc_*,_std::vector<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>_>
             ::operator*(&__end1);
    DWARFYAML::Loc::Loc((Loc *)local_58,pLVar3);
    pvVar4 = std::vector<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>::operator[]
                       (&DI->CompileUnits,0);
    bVar1 = pvVar4->AddrSize;
    writeVariableSizedInteger
              ((long)(int)local_58._0_4_,(ulong)bVar1,OS,(bool)(DI->IsLittleEndian & 1));
    writeVariableSizedInteger
              ((long)(int)stack0xffffffffffffffac,(ulong)bVar1,OS,(bool)(DI->IsLittleEndian & 1));
    if (((local_58._0_4_ != 0) || (stack0xffffffffffffffac != 0)) && (local_58._0_4_ != 0xffffffff))
    {
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&Loc);
      writeInteger<unsigned_short>((unsigned_short)sVar5,OS,(bool)(DI->IsLittleEndian & 1));
      __end3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&Loc);
      iStack_88 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&Loc);
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff78), bVar2) {
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&__end3);
        writeInteger<unsigned_char>(*puVar6,OS,(bool)(DI->IsLittleEndian & 1));
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&__end3);
      }
    }
    DWARFYAML::Loc::~Loc((Loc *)local_58);
    __gnu_cxx::
    __normal_iterator<const_llvm::DWARFYAML::Loc_*,_std::vector<llvm::DWARFYAML::Loc,_std::allocator<llvm::DWARFYAML::Loc>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void DWARFYAML::EmitDebugLoc(raw_ostream &OS, const DWARFYAML::Data &DI) {
  for (auto Loc : DI.Locs) {
    auto AddrSize = DI.CompileUnits[0].AddrSize;  // XXX BINARYEN
    // FIXME: Loc.Start etc should probably not be 32-bit.
    writeVariableSizedInteger((uint64_t)(int32_t)Loc.Start, AddrSize, OS, DI.IsLittleEndian);
    writeVariableSizedInteger((uint64_t)(int32_t)Loc.End, AddrSize, OS, DI.IsLittleEndian);
    if (Loc.Start == 0 && Loc.End == 0) {
      // End of a list.
      continue;
    }
    if (Loc.Start != -1) {
      writeInteger((uint16_t)Loc.Location.size(), OS, DI.IsLittleEndian);
      for (auto x : Loc.Location) {
        writeInteger((uint8_t)x, OS, DI.IsLittleEndian);
      }
    }
  }
}